

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall adios2::transport::ShmSystemV::CheckShmID(ShmSystemV *this,string *hint)

{
  allocator local_133;
  allocator local_132;
  allocator local_131;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (this->m_ShmID < 0) {
    std::__cxx11::string::string((string *)&local_30,"Toolkit",&local_131);
    std::__cxx11::string::string((string *)&local_50,"transport::shm::ShmSystemV",&local_132);
    std::__cxx11::string::string((string *)&local_70,"CheckShmID",&local_133);
    std::__cxx11::to_string(&local_130,this->m_Size);
    std::operator+(&local_110,"Failed shared memory segment of size ",&local_130);
    std::operator+(&local_f0,&local_110," and name ");
    std::operator+(&local_d0,&local_f0,&(this->super_Transport).m_Name);
    std::operator+(&local_b0,&local_d0,", ");
    std::operator+(&local_90,&local_b0,hint);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void ShmSystemV::CheckShmID(const std::string hint) const
{
    if (m_ShmID < 0)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::shm::ShmSystemV", "CheckShmID",
                                              "Failed shared memory segment of size " +
                                                  std::to_string(m_Size) + " and name " + m_Name +
                                                  ", " + hint);
    }
}